

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

void stb_arith_decode_advance(stb_arith *a,uint totalfreq,uint freq,uint cumfreq)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = a->range / totalfreq;
  a->code = a->code - cumfreq * uVar1;
  uVar1 = freq * uVar1;
  a->range = uVar1;
  while (uVar1 < 0x1000000) {
    iVar2 = (*a->output->getbyte)(a->output);
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    uVar1 = a->range;
    a->code = a->code * 0x100 + iVar2;
  }
  return;
}

Assistant:

void stb_arith_decode_advance(stb_arith *a, unsigned int totalfreq, unsigned int freq, unsigned int cumfreq)
{
   unsigned int freqsize = a->range / totalfreq; // @OPTIMIZE, share with above divide somehow?
   a->code -= freqsize * cumfreq;
   a->range = freqsize * freq;
   while (a->range < 0x1000000)
      stb__renorm_decoder(a);
}